

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_clericholy.cpp
# Opt level: O0

PalEntry __thiscall ACWeapWraithverge::GetBlend(ACWeapWraithverge *this)

{
  uint uVar1;
  ACWeapWraithverge *this_local;
  
  uVar1 = FIntCVar::operator_cast_to_int(&paletteflash);
  if ((uVar1 & 1) == 0) {
    PalEntry::PalEntry((PalEntry *)((long)&this_local + 4),
                       (BYTE)(((uint)(byte)(this->super_AClericWeapon).super_AWeapon.field_0x582 <<
                              7) / 3),0x83,0x83,0x83);
  }
  else if ((this->super_AClericWeapon).super_AWeapon.field_0x582 == '\x03') {
    PalEntry::PalEntry((PalEntry *)((long)&this_local + 4),0x80,'F','F','F');
  }
  else if ((this->super_AClericWeapon).super_AWeapon.field_0x582 == '\x02') {
    PalEntry::PalEntry((PalEntry *)((long)&this_local + 4),0x80,'d','d','d');
  }
  else if ((this->super_AClericWeapon).super_AWeapon.field_0x582 == '\x01') {
    PalEntry::PalEntry((PalEntry *)((long)&this_local + 4),0x80,0x82,0x82,0x82);
  }
  else {
    PalEntry::PalEntry((PalEntry *)((long)&this_local + 4),'\0','\0','\0','\0');
  }
  return (anon_union_4_2_12391d7c_for_PalEntry_0)
         (anon_union_4_2_12391d7c_for_PalEntry_0)this_local._4_4_;
}

Assistant:

PalEntry GetBlend ()
	{
		if (paletteflash & PF_HEXENWEAPONS)
		{
			if (CHolyCount == 3)
				return PalEntry(128, 70, 70, 70);
			else if (CHolyCount == 2)
				return PalEntry(128, 100, 100, 100);
			else if (CHolyCount == 1)
				return PalEntry(128, 130, 130, 130);
			else
				return PalEntry(0, 0, 0, 0);
		}
		else
		{
			return PalEntry (CHolyCount * 128 / 3, 131, 131, 131);
		}
	}